

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O0

uint32_t Assimp::FBX::anon_unknown_3::ReadWord(char *input,char **cursor,char *end)

{
  uint32_t uVar1;
  size_t sVar2;
  uint32_t word;
  allocator local_49;
  string local_48;
  undefined8 local_28;
  size_t k_to_read;
  char *end_local;
  char **cursor_local;
  char *input_local;
  
  local_28 = 4;
  k_to_read = (size_t)end;
  end_local = (char *)cursor;
  cursor_local = (char **)input;
  sVar2 = Offset(*cursor,end);
  if (sVar2 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"cannot ReadWord, out of bounds",&local_49);
    TokenizeError(&local_48,(char *)cursor_local,*(char **)end_local);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  uVar1 = **(uint32_t **)end_local;
  *(long *)end_local = *(long *)end_local + 4;
  return uVar1;
}

Assistant:

uint32_t ReadWord(const char* input, const char*& cursor, const char* end) {
    const size_t k_to_read = sizeof( uint32_t );
    if(Offset(cursor, end) < k_to_read ) {
        TokenizeError("cannot ReadWord, out of bounds",input, cursor);
    }

    uint32_t word;
    ::memcpy(&word, cursor, 4);
    AI_SWAP4(word);

    cursor += k_to_read;

    return word;
}